

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImFontGlyph_push_back(ImVector_ImFontGlyph *self,ImFontGlyph v)

{
  ImFontGlyph *pIVar1;
  int iVar2;
  ImFontGlyph *pIVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = self->Size;
  if (iVar2 == self->Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar5 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    pIVar3 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar5 * 0x28);
    if (self->Data != (ImFontGlyph *)0x0) {
      memcpy(pIVar3,self->Data,(long)self->Size * 0x28);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar3;
    self->Capacity = iVar5;
    iVar2 = self->Size;
  }
  else {
    pIVar3 = self->Data;
  }
  pIVar3[iVar2].U1 = v.U1;
  pIVar3[iVar2].V1 = v.V1;
  pIVar1 = pIVar3 + iVar2;
  pIVar1->X1 = v.X1;
  pIVar1->Y1 = v.Y1;
  *(undefined8 *)(&pIVar1->X1 + 2) = v._24_8_;
  pIVar3 = pIVar3 + iVar2;
  pIVar3->Codepoint = v.Codepoint;
  *(undefined2 *)&pIVar3->field_0x2 = v._2_2_;
  pIVar3->AdvanceX = v.AdvanceX;
  pIVar3->X0 = v.X0;
  pIVar3->Y0 = v.Y0;
  self->Size = self->Size + 1;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_push_back(ImVector_ImFontGlyph* self,const ImFontGlyph v)
{
    return self->push_back(v);
}